

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapepiram.cpp
# Opt level: O0

void pzshape::TPZShapePiram::ShapeGenerating
               (TPZVec<double> *pt,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double *pdVar9;
  REAL sidescale [19];
  int isface;
  int is3_1;
  int is2_3;
  int is1_3;
  int is3;
  int is2_2;
  int is1_2;
  int is2_1;
  int is1_1;
  int is2;
  int is1;
  int is;
  undefined8 in_stack_fffffffffffffc18;
  int node;
  undefined8 in_stack_fffffffffffffc20;
  double dVar10;
  double in_stack_fffffffffffffc30;
  double in_stack_fffffffffffffc38;
  TPZFMatrix<double> *in_stack_fffffffffffffc40;
  double local_e8 [20];
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  
  for (local_1c = 5; node = (int)((ulong)in_stack_fffffffffffffc18 >> 0x20), local_1c < 0xd;
      local_1c = local_1c + 1) {
    local_20 = pztopology::TPZPyramid::ContainedSideLocId((int)in_stack_fffffffffffffc20,node);
    local_24 = pztopology::TPZPyramid::ContainedSideLocId((int)in_stack_fffffffffffffc20,node);
    pdVar9 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                        (int64_t)in_stack_fffffffffffffc30);
    dVar10 = *pdVar9;
    pdVar9 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                        (int64_t)in_stack_fffffffffffffc30);
    dVar1 = *pdVar9;
    pdVar9 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                        (int64_t)in_stack_fffffffffffffc30);
    *pdVar9 = dVar10 * dVar1;
    pdVar9 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                        (int64_t)in_stack_fffffffffffffc30);
    dVar10 = *pdVar9;
    pdVar9 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                        (int64_t)in_stack_fffffffffffffc30);
    dVar1 = *pdVar9;
    pdVar9 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                        (int64_t)in_stack_fffffffffffffc30);
    dVar2 = *pdVar9;
    pdVar9 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                        (int64_t)in_stack_fffffffffffffc30);
    dVar3 = *pdVar9;
    pdVar9 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                        (int64_t)in_stack_fffffffffffffc30);
    *pdVar9 = dVar10 * dVar1 + dVar2 * dVar3;
    pdVar9 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                        (int64_t)in_stack_fffffffffffffc30);
    dVar10 = *pdVar9;
    pdVar9 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                        (int64_t)in_stack_fffffffffffffc30);
    dVar1 = *pdVar9;
    pdVar9 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                        (int64_t)in_stack_fffffffffffffc30);
    dVar2 = *pdVar9;
    pdVar9 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                        (int64_t)in_stack_fffffffffffffc30);
    dVar3 = *pdVar9;
    pdVar9 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                        (int64_t)in_stack_fffffffffffffc30);
    *pdVar9 = dVar10 * dVar1 + dVar2 * dVar3;
    pdVar9 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                        (int64_t)in_stack_fffffffffffffc30);
    dVar10 = *pdVar9;
    pdVar9 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                        (int64_t)in_stack_fffffffffffffc30);
    dVar1 = *pdVar9;
    pdVar9 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                        (int64_t)in_stack_fffffffffffffc30);
    dVar2 = *pdVar9;
    pdVar9 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                        (int64_t)in_stack_fffffffffffffc30);
    dVar3 = *pdVar9;
    pdVar9 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                        (int64_t)in_stack_fffffffffffffc30);
    *pdVar9 = dVar10 * dVar1 + dVar2 * dVar3;
  }
  local_1c = 0xd;
  local_28 = 0;
  local_2c = 2;
  pdVar9 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                      (int64_t)in_stack_fffffffffffffc30);
  dVar10 = *pdVar9;
  pdVar9 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                      (int64_t)in_stack_fffffffffffffc30);
  dVar1 = *pdVar9;
  pdVar9 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                      (int64_t)in_stack_fffffffffffffc30);
  *pdVar9 = dVar10 * dVar1;
  pdVar9 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                      (int64_t)in_stack_fffffffffffffc30);
  dVar10 = *pdVar9;
  pdVar9 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                      (int64_t)in_stack_fffffffffffffc30);
  dVar1 = *pdVar9;
  pdVar9 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                      (int64_t)in_stack_fffffffffffffc30);
  dVar2 = *pdVar9;
  pdVar9 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                      (int64_t)in_stack_fffffffffffffc30);
  dVar3 = *pdVar9;
  pdVar9 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                      (int64_t)in_stack_fffffffffffffc30);
  *pdVar9 = dVar10 * dVar1 + dVar2 * dVar3;
  pdVar9 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                      (int64_t)in_stack_fffffffffffffc30);
  dVar10 = *pdVar9;
  pdVar9 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                      (int64_t)in_stack_fffffffffffffc30);
  dVar1 = *pdVar9;
  pdVar9 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                      (int64_t)in_stack_fffffffffffffc30);
  dVar2 = *pdVar9;
  pdVar9 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                      (int64_t)in_stack_fffffffffffffc30);
  dVar3 = *pdVar9;
  pdVar9 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                      (int64_t)in_stack_fffffffffffffc30);
  *pdVar9 = dVar10 * dVar1 + dVar2 * dVar3;
  pdVar9 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                      (int64_t)in_stack_fffffffffffffc30);
  dVar10 = *pdVar9;
  pdVar9 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                      (int64_t)in_stack_fffffffffffffc30);
  dVar1 = *pdVar9;
  pdVar9 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                      (int64_t)in_stack_fffffffffffffc30);
  dVar2 = *pdVar9;
  pdVar9 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                      (int64_t)in_stack_fffffffffffffc30);
  dVar3 = *pdVar9;
  pdVar9 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                      (int64_t)in_stack_fffffffffffffc30);
  *pdVar9 = dVar10 * dVar1 + dVar2 * dVar3;
  while (local_1c = local_1c + 1, local_1c < 0x12) {
    local_30 = pztopology::TPZPyramid::ContainedSideLocId((int)in_stack_fffffffffffffc20,node);
    local_34 = pztopology::TPZPyramid::ContainedSideLocId((int)in_stack_fffffffffffffc20,node);
    local_38 = pztopology::TPZPyramid::ContainedSideLocId((int)in_stack_fffffffffffffc20,node);
    pdVar9 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                        (int64_t)in_stack_fffffffffffffc30);
    dVar10 = *pdVar9;
    pdVar9 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                        (int64_t)in_stack_fffffffffffffc30);
    dVar1 = *pdVar9;
    pdVar9 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                        (int64_t)in_stack_fffffffffffffc30);
    dVar2 = *pdVar9;
    pdVar9 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                        (int64_t)in_stack_fffffffffffffc30);
    *pdVar9 = dVar10 * dVar1 * dVar2;
    pdVar9 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                        (int64_t)in_stack_fffffffffffffc30);
    dVar10 = *pdVar9;
    pdVar9 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                        (int64_t)in_stack_fffffffffffffc30);
    dVar1 = *pdVar9;
    pdVar9 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                        (int64_t)in_stack_fffffffffffffc30);
    dVar2 = *pdVar9;
    pdVar9 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                        (int64_t)in_stack_fffffffffffffc30);
    dVar3 = *pdVar9;
    pdVar9 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                        (int64_t)in_stack_fffffffffffffc30);
    dVar4 = *pdVar9;
    pdVar9 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                        (int64_t)in_stack_fffffffffffffc30);
    dVar5 = *pdVar9;
    pdVar9 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                        (int64_t)in_stack_fffffffffffffc30);
    dVar6 = *pdVar9;
    pdVar9 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                        (int64_t)in_stack_fffffffffffffc30);
    dVar7 = *pdVar9;
    pdVar9 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                        (int64_t)in_stack_fffffffffffffc30);
    dVar8 = *pdVar9;
    pdVar9 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                        (int64_t)in_stack_fffffffffffffc30);
    *pdVar9 = dVar6 * dVar7 * dVar8 + dVar10 * dVar1 * dVar2 + dVar3 * dVar4 * dVar5;
    pdVar9 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                        (int64_t)in_stack_fffffffffffffc30);
    dVar10 = *pdVar9;
    pdVar9 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                        (int64_t)in_stack_fffffffffffffc30);
    dVar1 = *pdVar9;
    pdVar9 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                        (int64_t)in_stack_fffffffffffffc30);
    dVar2 = *pdVar9;
    pdVar9 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                        (int64_t)in_stack_fffffffffffffc30);
    dVar3 = *pdVar9;
    pdVar9 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                        (int64_t)in_stack_fffffffffffffc30);
    dVar4 = *pdVar9;
    pdVar9 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                        (int64_t)in_stack_fffffffffffffc30);
    dVar5 = *pdVar9;
    pdVar9 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                        (int64_t)in_stack_fffffffffffffc30);
    dVar6 = *pdVar9;
    pdVar9 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                        (int64_t)in_stack_fffffffffffffc30);
    dVar7 = *pdVar9;
    pdVar9 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                        (int64_t)in_stack_fffffffffffffc30);
    dVar8 = *pdVar9;
    pdVar9 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                        (int64_t)in_stack_fffffffffffffc30);
    *pdVar9 = dVar6 * dVar7 * dVar8 + dVar10 * dVar1 * dVar2 + dVar3 * dVar4 * dVar5;
    pdVar9 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                        (int64_t)in_stack_fffffffffffffc30);
    dVar10 = *pdVar9;
    pdVar9 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                        (int64_t)in_stack_fffffffffffffc30);
    dVar1 = *pdVar9;
    pdVar9 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                        (int64_t)in_stack_fffffffffffffc30);
    dVar2 = *pdVar9;
    pdVar9 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                        (int64_t)in_stack_fffffffffffffc30);
    dVar3 = *pdVar9;
    pdVar9 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                        (int64_t)in_stack_fffffffffffffc30);
    dVar4 = *pdVar9;
    pdVar9 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                        (int64_t)in_stack_fffffffffffffc30);
    dVar5 = *pdVar9;
    pdVar9 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                        (int64_t)in_stack_fffffffffffffc30);
    dVar6 = *pdVar9;
    pdVar9 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                        (int64_t)in_stack_fffffffffffffc30);
    dVar7 = *pdVar9;
    pdVar9 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                        (int64_t)in_stack_fffffffffffffc30);
    dVar8 = *pdVar9;
    pdVar9 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                        (int64_t)in_stack_fffffffffffffc30);
    *pdVar9 = dVar6 * dVar7 * dVar8 + dVar10 * dVar1 * dVar2 + dVar3 * dVar4 * dVar5;
  }
  local_3c = 0;
  local_40 = 2;
  local_44 = 4;
  pdVar9 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                      (int64_t)in_stack_fffffffffffffc30);
  dVar10 = *pdVar9;
  pdVar9 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                      (int64_t)in_stack_fffffffffffffc30);
  dVar1 = *pdVar9;
  pdVar9 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                      (int64_t)in_stack_fffffffffffffc30);
  dVar2 = *pdVar9;
  pdVar9 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                      (int64_t)in_stack_fffffffffffffc30);
  *pdVar9 = dVar10 * dVar1 * dVar2;
  pdVar9 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                      (int64_t)in_stack_fffffffffffffc30);
  dVar10 = *pdVar9;
  pdVar9 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                      (int64_t)in_stack_fffffffffffffc30);
  dVar1 = *pdVar9;
  pdVar9 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                      (int64_t)in_stack_fffffffffffffc30);
  dVar2 = *pdVar9;
  pdVar9 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                      (int64_t)in_stack_fffffffffffffc30);
  dVar3 = *pdVar9;
  pdVar9 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                      (int64_t)in_stack_fffffffffffffc30);
  dVar4 = *pdVar9;
  pdVar9 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                      (int64_t)in_stack_fffffffffffffc30);
  dVar5 = *pdVar9;
  pdVar9 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                      (int64_t)in_stack_fffffffffffffc30);
  dVar6 = *pdVar9;
  pdVar9 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                      (int64_t)in_stack_fffffffffffffc30);
  dVar7 = *pdVar9;
  pdVar9 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                      (int64_t)in_stack_fffffffffffffc30);
  dVar8 = *pdVar9;
  pdVar9 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                      (int64_t)in_stack_fffffffffffffc30);
  *pdVar9 = dVar6 * dVar7 * dVar8 + dVar10 * dVar1 * dVar2 + dVar3 * dVar4 * dVar5;
  pdVar9 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                      (int64_t)in_stack_fffffffffffffc30);
  dVar10 = *pdVar9;
  pdVar9 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                      (int64_t)in_stack_fffffffffffffc30);
  dVar1 = *pdVar9;
  pdVar9 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                      (int64_t)in_stack_fffffffffffffc30);
  dVar2 = *pdVar9;
  pdVar9 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                      (int64_t)in_stack_fffffffffffffc30);
  dVar3 = *pdVar9;
  pdVar9 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                      (int64_t)in_stack_fffffffffffffc30);
  dVar4 = *pdVar9;
  pdVar9 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                      (int64_t)in_stack_fffffffffffffc30);
  dVar5 = *pdVar9;
  pdVar9 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                      (int64_t)in_stack_fffffffffffffc30);
  dVar6 = *pdVar9;
  pdVar9 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                      (int64_t)in_stack_fffffffffffffc30);
  dVar7 = *pdVar9;
  pdVar9 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                      (int64_t)in_stack_fffffffffffffc30);
  dVar8 = *pdVar9;
  pdVar9 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                      (int64_t)in_stack_fffffffffffffc30);
  *pdVar9 = dVar6 * dVar7 * dVar8 + dVar10 * dVar1 * dVar2 + dVar3 * dVar4 * dVar5;
  pdVar9 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                      (int64_t)in_stack_fffffffffffffc30);
  dVar10 = *pdVar9;
  pdVar9 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                      (int64_t)in_stack_fffffffffffffc30);
  dVar1 = *pdVar9;
  pdVar9 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                      (int64_t)in_stack_fffffffffffffc30);
  dVar2 = *pdVar9;
  pdVar9 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                      (int64_t)in_stack_fffffffffffffc30);
  dVar3 = *pdVar9;
  pdVar9 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                      (int64_t)in_stack_fffffffffffffc30);
  dVar4 = *pdVar9;
  pdVar9 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                      (int64_t)in_stack_fffffffffffffc30);
  dVar5 = *pdVar9;
  pdVar9 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                      (int64_t)in_stack_fffffffffffffc30);
  dVar6 = *pdVar9;
  pdVar9 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                      (int64_t)in_stack_fffffffffffffc30);
  dVar7 = *pdVar9;
  pdVar9 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                      (int64_t)in_stack_fffffffffffffc30);
  dVar8 = *pdVar9;
  pdVar9 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                      (int64_t)in_stack_fffffffffffffc30);
  *pdVar9 = dVar6 * dVar7 * dVar8 + dVar10 * dVar1 * dVar2 + dVar3 * dVar4 * dVar5;
  for (local_1c = 5; local_1c < 9; local_1c = local_1c + 1) {
    local_48 = 0xd;
    pdVar9 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                        (int64_t)in_stack_fffffffffffffc30);
    in_stack_fffffffffffffc38 = *pdVar9;
    pdVar9 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                        (int64_t)in_stack_fffffffffffffc30);
    *pdVar9 = in_stack_fffffffffffffc38 + *pdVar9;
    pdVar9 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                        (int64_t)in_stack_fffffffffffffc30);
    in_stack_fffffffffffffc40 = (TPZFMatrix<double> *)*pdVar9;
    pdVar9 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                        (int64_t)in_stack_fffffffffffffc30);
    *pdVar9 = (double)in_stack_fffffffffffffc40 + *pdVar9;
    pdVar9 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                        (int64_t)in_stack_fffffffffffffc30);
    dVar10 = *pdVar9;
    pdVar9 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                        (int64_t)in_stack_fffffffffffffc30);
    *pdVar9 = dVar10 + *pdVar9;
    pdVar9 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                        (int64_t)in_stack_fffffffffffffc30);
    dVar10 = *pdVar9;
    pdVar9 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                        (int64_t)in_stack_fffffffffffffc30);
    *pdVar9 = dVar10 + *pdVar9;
  }
  memcpy(local_e8,&DAT_02097960,0x98);
  for (local_1c = 5; local_1c < 0x13; local_1c = local_1c + 1) {
    dVar10 = local_e8[local_1c];
    pdVar9 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                        (int64_t)in_stack_fffffffffffffc30);
    *pdVar9 = dVar10 * *pdVar9;
    dVar10 = local_e8[local_1c];
    pdVar9 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                        (int64_t)in_stack_fffffffffffffc30);
    *pdVar9 = dVar10 * *pdVar9;
    dVar10 = local_e8[local_1c];
    pdVar9 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                        (int64_t)in_stack_fffffffffffffc30);
    *pdVar9 = dVar10 * *pdVar9;
    in_stack_fffffffffffffc30 = local_e8[local_1c];
    pdVar9 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc40,(int64_t)in_stack_fffffffffffffc38,
                        (int64_t)in_stack_fffffffffffffc30);
    *pdVar9 = in_stack_fffffffffffffc30 * *pdVar9;
  }
  return;
}

Assistant:

void TPZShapePiram::ShapeGenerating(const TPZVec<REAL> &pt, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &dphi)
	{
		int is;
		// contribute the ribs
		for(is=NCornerNodes; is<NCornerNodes+8; is++)
		{
			int is1,is2;
			is1 = ContainedSideLocId(is,0);
			is2 = ContainedSideLocId(is,1);
			phi(is,0) = phi(is1,0)*phi(is2,0);
			dphi(0,is) = dphi(0,is1)*phi(is2,0)+phi(is1,0)*dphi(0,is2);
			dphi(1,is) = dphi(1,is1)*phi(is2,0)+phi(is1,0)*dphi(1,is2);
			dphi(2,is) = dphi(2,is1)*phi(is2,0)+phi(is1,0)*dphi(2,is2);
		}
		// contribution of the faces
		// quadrilateral face
		is = 13;
		{
			int is1,is2;
			is1 = ShapeFaceId[0][0];// SideConnectLocId(is,0);
			is2 = ShapeFaceId[0][2];// SideConnectLocId(is,2);
			phi(is,0) = phi(is1,0)*phi(is2,0);
			dphi(0,is) = dphi(0,is1)*phi(is2,0)+phi(is1,0)*dphi(0,is2);
			dphi(1,is) = dphi(1,is1)*phi(is2,0)+phi(is1,0)*dphi(1,is2);
			dphi(2,is) = dphi(2,is1)*phi(is2,0)+phi(is1,0)*dphi(2,is2);
		}
		is++;
		// triangular faces
		for(;is<18; is++)
		{
			int is1,is2,is3;
			is1 = ContainedSideLocId(is,0);
			is2 = ContainedSideLocId(is,1);
			is3 = ContainedSideLocId(is,2);
			phi(is,0) = phi(is1,0)*phi(is2,0)*phi(is3,0);
			dphi(0,is) = dphi(0,is1)*phi(is2,0)*phi(is3,0)+phi(is1,0)*dphi(0,is2)*phi(is3,0)+phi(is1,0)*phi(is2,0)*dphi(0,is3);
			dphi(1,is) = dphi(1,is1)*phi(is2,0)*phi(is3,0)+phi(is1,0)*dphi(1,is2)*phi(is3,0)+phi(is1,0)*phi(is2,0)*dphi(1,is3);
			dphi(2,is) = dphi(2,is1)*phi(is2,0)*phi(is3,0)+phi(is1,0)*dphi(2,is2)*phi(is3,0)+phi(is1,0)*phi(is2,0)*dphi(2,is3);
			
		}
		{
			int is1 = 0;
			int is2 = 2;
			int is3 = 4;
			phi(is,0) = phi(is1,0)*phi(is2,0)*phi(is3,0);
			dphi(0,is) = dphi(0,is1)*phi(is2,0)*phi(is3,0)+phi(is1,0)*dphi(0,is2)*phi(is3,0)+phi(is1,0)*phi(is2,0)*dphi(0,is3);
			dphi(1,is) = dphi(1,is1)*phi(is2,0)*phi(is3,0)+phi(is1,0)*dphi(1,is2)*phi(is3,0)+phi(is1,0)*phi(is2,0)*dphi(1,is3);
			dphi(2,is) = dphi(2,is1)*phi(is2,0)*phi(is3,0)+phi(is1,0)*dphi(2,is2)*phi(is3,0)+phi(is1,0)*phi(is2,0)*dphi(2,is3);
		}
		
		// Make the generating shape functions linear and unitary
		// contribute the ribs
		for(is=NCornerNodes; is<NCornerNodes+4; is++)
		{
			int isface = 13;
			phi(is,0) += phi(isface,0);
			dphi(0,is) += dphi(0,isface);
			dphi(1,is) += dphi(1,isface);
			dphi(2,is) += dphi(2,isface);
		}
		// scaling the shapefunctions
		{
			REAL sidescale[] = {1.,1.,1.,1.,1.,4.,4.,4.,4.,4.,4.,4.,4.,16.,27.,27.,27.,27.,64.};
			for(is=5; is<NSides; is++)
			{
				phi(is,0) *= sidescale[is];
				dphi(0,is) *= sidescale[is];
				dphi(1,is) *= sidescale[is];
				dphi(2,is) *= sidescale[is];
			}
		}
		
		
	}